

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decide.cpp
# Opt level: O2

double Place_Turn(int dep,GameBoard *gameBoard,int pl_col,int this_bl_type,int *finalX,int *finalY,
                 int *finalO,int *blockFE)

{
  double *pdVar1;
  undefined8 *puVar2;
  pointer pdVar3;
  Tetris te;
  pointer pTVar4;
  _Self __tmp_1;
  _Rb_tree_node_base *p_Var5;
  time_t tVar6;
  _Base_ptr p_Var7;
  undefined8 extraout_RAX;
  ulong uVar8;
  ulong uVar9;
  bool *pbVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  bool *ele;
  undefined4 in_register_0000003c;
  pointer pvVar16;
  Standard_Simplex *this;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  double dVar21;
  _Self __tmp;
  int this_ht;
  int ch2;
  ulong uStack_1cfa0;
  undefined8 uStack_1cf98;
  ulong uStack_1cf90;
  vector<Tetris,_std::allocator<Tetris>_> loc;
  int ch1;
  ulong uStack_1cf58;
  int *piStack_1cf50;
  int *piStack_1cf48;
  int *piStack_1cf40;
  vector<int,_std::allocator<int>_> index;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  A;
  set<Plan,_std::less<Plan>,_std::allocator<Plan>_> s;
  double p2 [45];
  double p1 [45];
  GameBoard nowBoard;
  Standard_Simplex ss;
  Slash_Simplex as;
  
  uStack_1cf98 = CONCAT44(in_register_0000003c,dep);
  if (dep == 5) {
    dVar21 = naive_place(gameBoard,pl_col,this_bl_type);
    return dVar21;
  }
  loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uStack_1cfa0 = CONCAT44(uStack_1cfa0._4_4_,this_bl_type);
  GameBoard::getPlaces(gameBoard,pl_col,this_bl_type,&loc,true);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&A,((long)loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                     super__Vector_impl_data._M_finish -
              (long)loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                    super__Vector_impl_data._M_start) / 0x28,(allocator_type *)&as);
  index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &s._M_t._M_impl.super__Rb_tree_header._M_header;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  s._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  s._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  GameBoard::GameBoard(&nowBoard);
  if (loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    dVar21 = -100000.0;
  }
  else {
    piStack_1cf50 = finalO;
    lVar14 = 0;
    this = &ss;
    ele = (bool *)&ch2;
    piStack_1cf48 = finalX;
    piStack_1cf40 = finalY;
    for (uVar18 = 0;
        uVar18 < (ulong)(((long)loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0x28); uVar18 = uVar18 + 1) {
      global_i = (int)uVar18;
      Board::Board((Board *)this,pl_col,gameBoard);
      Board::Board((Board *)p1,pl_col,gameBoard);
      puVar2 = (undefined8 *)
               ((long)&(loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                        super__Vector_impl_data._M_start)->blockY + lVar14);
      te._16_8_ = *puVar2;
      te._0_16_ = *(undefined1 (*) [16])
                   ((long)&(loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                            super__Vector_impl_data._M_start)->gameBoard + lVar14);
      te.shape = (int (*) [8])puVar2[1];
      te._32_8_ = *(undefined8 *)
                   ((long)&(loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                            super__Vector_impl_data._M_start)->color + lVar14);
      Block::Block((Block *)p2,te);
      memcpy(&as,this,0x88);
      ch2._0_1_ = 0;
      if (Eval.super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        goto LAB_0011bc28;
      }
      dVar21 = (*Eval._M_invoker)((_Any_data *)&Eval,(Board *)&as,(Block *)p2,(double *)&ch1,ele);
      eval((Board *)p1,(Block *)p2,(int *)ele,&this_ht);
      as._0_8_ = dVar21;
      if ((int)uStack_1cf98 == 1) {
        if (gameBoard->currBotColor == pl_col) {
          as._0_8_ = dVar21 + -100.0;
          if (enemyele + this_ht < 0x15) {
            as._0_8_ = dVar21;
          }
          if (0x14 < enemyht + myele) {
            as._0_8_ = (double)as._0_8_ + 10000.0;
          }
        }
        else if (0x14 < this_ht + myele) {
          as._0_8_ = dVar21 + -100.0;
        }
      }
      as.b[0]._0_4_ = (int)uVar18;
      std::_Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_>::
      _M_insert_unique<Plan>(&s._M_t,(Plan *)&as);
      lVar14 = lVar14 + 0x28;
    }
    iVar13 = (int)uStack_1cf98;
    lVar17 = 0;
    lVar15 = 0;
    p_Var7 = s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      pTVar4 = loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
               super__Vector_impl_data._M_start;
      uStack_1cf58 = ((long)loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.
                           super__Vector_impl_data._M_start) / 0x28;
      uVar18 = 10;
      if ((int)uStack_1cf58 < 10) {
        uVar18 = uStack_1cf58;
      }
      uVar12 = uVar18 & 0xffffffff;
      lVar14 = (long)(int)uVar18;
      if (lVar14 <= lVar15) break;
      iVar11 = *(int *)&p_Var7[1]._M_left;
      uStack_1cf90 = lVar15;
      memcpy(&nowBoard,gameBoard,0xa24);
      GameBoard::place(&nowBoard,pl_col,(int)uStack_1cfa0,pTVar4[iVar11].blockX,
                       pTVar4[iVar11].blockY,pTVar4[iVar11].orientation);
      GameBoard::eliminate(&nowBoard,pl_col);
      Jam_Turn((vector<int,_std::allocator<int>_> *)&as,iVar13 + 1,&nowBoard,pl_col,
               (vector<double,_std::allocator<double>_> *)
               ((long)&((A.
                         super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar17));
      std::vector<int,_std::allocator<int>_>::_M_move_assign(&index,&as);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&as);
      lVar15 = uStack_1cf90 + 1;
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      lVar17 = lVar17 + 0x18;
    }
    uVar8 = (long)((A.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)((A.
                    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->
                  super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    uStack_1cf90 = uVar8 >> 3;
    lVar15 = (long)(int)uStack_1cf98;
    uVar19 = 0;
    ele = (bool *)0x0;
    if (0 < (int)uStack_1cf90) {
      ele = (bool *)(uStack_1cf90 & 0xffffffff);
    }
    p_Var5 = s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    uStack_1cfa0 = uVar12;
    uVar9 = 0;
    if (0 < (int)uVar18) {
      uVar9 = uVar12;
    }
    for (; uVar19 != uVar9; uVar19 = uVar19 + 1) {
      dVar21 = *(double *)(p_Var5 + 1);
      p_Var7 = p_Var5[1]._M_parent;
      for (pbVar10 = (bool *)0x0; ele != pbVar10; pbVar10 = pbVar10 + 1) {
        pdVar3 = A.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar19].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar3[(long)pbVar10] =
             F_ROUND_WIGHT[lVar15] * dVar21 + pdVar3[(long)pbVar10] + (double)p_Var7;
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    }
    memset(ss.b,0,0x61f8);
    ss.n = (int)uStack_1cfa0 + 2;
    iVar13 = (int)uStack_1cf90 + 2;
    ss.c[lVar14 + 1] = 1.0;
    ss.c[lVar14 + 2] = -1.0;
    for (uVar18 = 1; uVar18 != (int)ele + 1; uVar18 = uVar18 + 1) {
      ss.b[uVar18] = 0.0;
      pvVar16 = A.
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      for (lVar15 = 0xa7; lVar15 + -0xa6 <= lVar14; lVar15 = lVar15 + 1) {
        this->b[lVar15 + -1] =
             -(pvVar16->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar18 - 1];
        pvVar16 = pvVar16 + 1;
      }
      pdVar1 = ss.a[uVar18] + lVar14 + 1;
      *pdVar1 = 1.0;
      pdVar1[1] = -1.0;
      this = (Standard_Simplex *)(this->b + 0x36);
    }
    lVar17 = uVar8 * 0x20000000 + 0x100000000;
    *(undefined8 *)((long)ss.b + (lVar17 >> 0x1d)) = 0x3ff0000000000000;
    ss.m = iVar13;
    for (lVar15 = 0x70; lVar15 + -0x6f <= lVar14; lVar15 = lVar15 + 1) {
      ss.b[(lVar17 >> 0x20) * 0x37 + lVar15 + -1] = 1.0;
    }
    ss.b[iVar13] = -1.0;
    for (lVar15 = 0x70; lVar15 + -0x6f <= lVar14; lVar15 = lVar15 + 1) {
      ss.b[(long)iVar13 * 0x37 + lVar15 + -1] = -1.0;
    }
    Slash_Simplex::Slash_Simplex(&as,&ss);
    Slash_Simplex::simplex(&as,false);
    dVar21 = as.rel;
    if ((int)uStack_1cf98 == 1) {
LAB_0011bc28:
      iVar13 = gameBoard->turnID;
      tVar6 = time((time_t *)0x0);
      srand(iVar13 * (int)tVar6);
      lVar15 = 0;
      while (lVar15 + 1 <= lVar14) {
        dVar21 = 0.0;
        if (as.basic[lVar15 + 1] == true) {
          dVar21 = as.b[lVar15 + 1];
        }
        p1[lVar15 + 1] = dVar21;
        lVar15 = lVar15 + 1;
      }
      iVar13 = 10;
      if ((int)uStack_1cf58 < 10) {
        iVar13 = (int)uStack_1cf58;
      }
      for (pbVar10 = (bool *)0x0; ele != pbVar10; pbVar10 = pbVar10 + 1) {
        iVar11 = iVar13 + 3 + (int)pbVar10;
        dVar21 = 0.0;
        if (as.basic[iVar11] == false) {
          dVar21 = -as.c[iVar11];
        }
        p2[(long)(pbVar10 + 1)] = dVar21;
      }
      get_CH(p1,(int)uStack_1cfa0,&ch1);
      p_Var7 = s._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      iVar13 = 0;
      if (0 < ch1) {
        iVar13 = ch1;
      }
      while (bVar20 = iVar13 != 0, iVar13 = iVar13 + -1, bVar20) {
        p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
      }
      iVar13 = *(int *)&p_Var7[1]._M_left;
      *piStack_1cf48 =
           loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar13].blockX;
      *piStack_1cf40 =
           loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar13].blockY;
      *piStack_1cf50 =
           loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>._M_impl.super__Vector_impl_data.
           _M_start[iVar13].orientation;
      get_CH(p2,(int)uStack_1cf90,&ch2);
      std::_Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_>::
      ~_Rb_tree(&s._M_t);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&index.super__Vector_base<int,_std::allocator<int>_>);
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&A);
      std::_Vector_base<Tetris,_std::allocator<Tetris>_>::~_Vector_base
                (&loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>);
      _Unwind_Resume(extraout_RAX);
    }
  }
  std::_Rb_tree<Plan,_Plan,_std::_Identity<Plan>,_std::less<Plan>,_std::allocator<Plan>_>::~_Rb_tree
            (&s._M_t);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&index.super__Vector_base<int,_std::allocator<int>_>);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&A);
  std::_Vector_base<Tetris,_std::allocator<Tetris>_>::~_Vector_base
            (&loc.super__Vector_base<Tetris,_std::allocator<Tetris>_>);
  return dVar21;
}

Assistant:

double Place_Turn(int dep, GameBoard& gameBoard, int pl_col, int this_bl_type, int &finalX = nouse, int &finalY = nouse, int &finalO = nouse, int &blockFE = nouse) //floc 表示最终选的块的位置,blockFE表示给敌人的块
{
    if (dep == (gameBoard.turnID < 10 ? DEPTH_LIM_2 : DEPTH_LIM_1)) //最后一层直接贪
        return naive_place(gameBoard, pl_col, this_bl_type);
    //debug(dep);
    std::vector<Tetris> loc;
    gameBoard.getPlaces(pl_col, this_bl_type, loc);
    int i, j, n, m;
    vector<vector<double> > A(loc.size());
    vector<int> index;
    set<Plan> s;
    GameBoard nowBoard;
    if(loc.size() == 0)
        return -1e5;
    for (i = 0; i < loc.size(); i++)
    {
        global_i = i;
        #ifdef DEBUG_DECIDE
        debug(i);
        debug(loc[i].blockX);
        debug(loc[i].blockY);
        debug(loc[i].orientation);
        #endif
        Board myBoard(pl_col, gameBoard), myBoard2(pl_col, gameBoard);
        Block now_bl = Block(loc[i]);
        double inh;
        double now_val = Eval(myBoard, now_bl, inh,0);
        int this_ele, this_ht;
        eval(myBoard2, now_bl, this_ele, this_ht);
        if(dep == 1)
        {
            if(pl_col == gameBoard.currBotColor) //考虑自己的局面
            {
                if(this_ht + enemyele > 20)
                    now_val -= Risk_Value;
                if(myele + enemyht > 20)
                    now_val += MustWin;
            }
            else
            {
                if(myele + this_ht > 20)
                    now_val -= Risk_Value;
            }
        }
        
        s.insert(Plan(now_val, inh, i));
    }
        //debug(now_val);
    set<Plan>::iterator it=s.begin();
    for (i = 0; i < min((int)loc.size(), MAX_SEARCH); i++, it++)    
    {
        int ind = (*it).idx;
        //debug(ind);
        #ifdef DEBUG_DECIDE
        debug(loc[ind].blockX);
        debug(loc[ind].blockY);
        debug(loc[ind].orientation);
        debug((*it).eva);
        #endif
        nowBoard = gameBoard;
        nowBoard.place(pl_col, this_bl_type, loc[ind].blockX, loc[ind].blockY, loc[ind].orientation);
        nowBoard.eliminate(pl_col);
        index = Jam_Turn(dep + 1, nowBoard, pl_col, A[i]);
    }
    n = min((int)loc.size(), MAX_SEARCH);
    m = A[0].size();

    //debug(n);
    //debug(m);
    for(it = s.begin(), i = 0; i < n; i++, it++)
    {
        double val = (*it).eva;
        double inh = (*it).inh;
        for (j = 0; j < m; j++)
        {
            #ifdef DEBUG_DECIDE
            cerr << A[i][j] << " ";
            #endif
            A[i][j] += val * F_ROUND_WIGHT[dep];
            A[i][j] += inh;
        }
        #ifdef DEBUG_DECIDE
        cerr << endl;
        #endif
    }
    Standard_Simplex ss;
    ss.n = n + 2, ss.m = m + 2;
    ss.c[n+1] = 1;
    ss.c[n+2] = -1;
    for(i = 1; i <= m; i++)
    {
        ss.b[i] = 0;
        for(j = 1; j <= n; j++)
            ss.a[i][j] = -A[j-1][i-1]; //注意下标要-1
        ss.a[i][n+1] = 1;
        ss.a[i][n+2] = -1;
    }   
    ss.b[m+1] = 1;
    for(j = 1; j <= n; j++)
        ss.a[m+1][j] = 1;
    ss.b[m+2] = -1;
    for(j = 1; j <= n; j++)
        ss.a[m+2][j] = -1;

    Slash_Simplex as(ss);
    //as.Print();
    int zt = as.simplex(0);
    //debug("end*******************************************");
    if(dep != 1) //不是第一层就不用考虑决策的事情
        return as.rel;
    //决策过程
    srand(gameBoard.turnID * time(0));
    double p1[45], p2[45], rd, sum;
    int ch1, ch2;
    for (i = 1; i <= n; i++)
    {
        if(as.basic[i])
            p1[i] = as.b[i];
        else p1[i] = 0;
        #ifdef DEBUG_DECIDE
        cerr << p1[i] << " ";
        #endif
    }
    #ifdef DEBUG_DECIDE
    cerr << endl;
    #endif
    for (i = 1; i <= m; i++) //得到对偶的答案
    {
        if(!as.basic[i+n+2])
            p2[i] = -as.c[i+n+2];
        else p2[i] = 0;
        #ifdef DEBUG_DECIDE
        cerr << p2[i] << " ";
        #endif
    }

    //debug("get ans");
    #ifdef DEBUG_DECIDE
    cerr << endl;
    #endif
    
    get_CH(p1,n,ch1);
    //debug(ch1);
    for (it = s.begin(), i = 0; i < ch1; i++, it++);
    int ind = (*it).idx;
    finalX = loc[ind].blockX;
    finalY = loc[ind].blockY;
    finalO = loc[ind].orientation;
    //debug(ch1);
    //debug("get loc");

    get_CH(p2,m,ch2);

    /*sum = 0;
    max_p = 0;
    rd = (double)(rand()%10000) / 10000.0;
    for (i = 1; i <= m; i++)
        if(p2[i] >= max_p)
        {
            ch2 = i - 1;
            max_p = p2[i];
            //break;
        }
        //else sum += p2[i];
    */
    blockFE = index[ch2];
}